

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

Word * cppjieba::GetWordFromRunes
                 (Word *__return_storage_ptr__,string *s,const_iterator left,const_iterator right)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  string local_50 [32];
  
  if (left->offset <= right->offset) {
    uVar1 = right->unicode_offset;
    uVar2 = right->unicode_length;
    uVar3 = left->unicode_offset;
    std::__cxx11::string::substr((ulong)local_50,(ulong)s);
    uVar4 = left->offset;
    uVar5 = left->unicode_offset;
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_50);
    __return_storage_ptr__->offset = uVar4;
    __return_storage_ptr__->unicode_offset = uVar5;
    __return_storage_ptr__->unicode_length = (uVar1 - uVar3) + uVar2;
    std::__cxx11::string::~string(local_50);
    return __return_storage_ptr__;
  }
  __assert_fail("right->offset >= left->offset",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/Unicode.hpp"
                ,0xc2,
                "Word cppjieba::GetWordFromRunes(const string &, RuneStrArray::const_iterator, RuneStrArray::const_iterator)"
               );
}

Assistant:

inline Word GetWordFromRunes(const string& s, RuneStrArray::const_iterator left, RuneStrArray::const_iterator right) {
  assert(right->offset >= left->offset);
  uint32_t len = right->offset - left->offset + right->len;
  uint32_t unicode_length = right->unicode_offset - left->unicode_offset + right->unicode_length;
  return Word(s.substr(left->offset, len), left->offset, left->unicode_offset, unicode_length);
}